

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

string * __thiscall
vkt::tessellation::(anonymous_namespace)::Variable::declare_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string local_70;
  DeclareVariable local_50;
  
  glu::decl::DeclareVariable::DeclareVariable
            (&local_50,(VarType *)((long)this + 0x28),(string *)((long)this + 8),0);
  de::toString<glu::decl::DeclareVariable>(&local_70,&local_50);
  std::operator+(__return_storage_ptr__,&local_70,";\n");
  std::__cxx11::string::~string((string *)&local_70);
  glu::decl::DeclareVariable::~DeclareVariable(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::declare (void) const
{
	DE_ASSERT(!m_isArray);
	return de::toString(glu::declare(m_type, m_name)) + ";\n";
}